

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_value.c
# Opt level: O1

int mpt_print_value(mpt_value *val,_func_ssize_t_void_ptr_char_ptr_size_t *save,void *dest)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ssize_t sVar5;
  mpt_type_traits *pmVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  void *ptr;
  size_t len;
  mpt_value pos;
  char buf [256];
  undefined8 *local_188;
  undefined8 *local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  size_t local_150;
  mpt_value local_148;
  char local_138 [264];
  
  local_170 = (undefined8 *)val->_addr;
  if (local_170 == (undefined8 *)0x0) {
    return -2;
  }
  iVar2 = (int)val->_type;
  if (iVar2 == 0x80) {
    if ((mpt_convertable *)*local_170 != (mpt_convertable *)0x0) {
      iVar2 = mpt_print_convertable((mpt_convertable *)*local_170,save,dest);
      return iVar2;
    }
  }
  else {
    if (iVar2 != 0x84) {
      pcVar4 = mpt_data_tostring(&local_170,(long)iVar2,&local_150);
      if (pcVar4 == (char *)0x0) {
        uVar9 = iVar2 + 0x20U & 0xff;
        if (uVar9 != 0 && 0xffffffe5 < iVar2 - 0x5aU) {
          local_158 = (ulong)uVar9;
          pmVar6 = mpt_type_traits(local_158);
          local_188 = local_170;
          if (pmVar6 == (mpt_type_traits *)0x0) {
            return -3;
          }
          if (pmVar6->size == 0) {
            return -3;
          }
          sVar5 = (*save)(dest,"[ ",2);
          iVar11 = (int)sVar5;
          iVar2 = -0x11;
          if (iVar11 < 2) {
            return -0x11;
          }
          if (local_188 != (undefined8 *)0x0) {
            local_168 = pmVar6->size;
            uVar8 = local_188[1];
            local_160 = uVar8 / local_168;
            bVar12 = local_168 <= uVar8;
            if (local_168 <= uVar8) {
              local_188 = (undefined8 *)*local_188;
              uVar8 = 0;
              iVar10 = iVar2;
              do {
                if (uVar9 == 0x73) {
                  pcVar4 = (char *)*local_188;
                  if (pcVar4 == (char *)0x0) {
                    iVar2 = 0;
                    pcVar4 = "";
                  }
                  else {
                    sVar7 = strlen(pcVar4);
                    iVar2 = (int)sVar7;
                  }
LAB_0011226e:
                  sVar5 = (*save)(dest,pcVar4,(long)iVar2);
                  if ((int)sVar5 < iVar2) {
                    bVar1 = false;
                    iVar2 = -0x11;
                  }
                  else {
                    iVar11 = iVar11 + (int)sVar5;
                    sVar5 = (*save)(dest," ",1);
                    iVar3 = (int)sVar5;
                    if (iVar3 < 1) {
                      iVar2 = -0x11;
                    }
                    else {
                      iVar11 = iVar11 + iVar3;
                      local_188 = (undefined8 *)((long)local_188 + local_168);
                      iVar2 = iVar10;
                    }
                    bVar1 = iVar3 >= 1;
                  }
                }
                else {
                  local_148._addr = local_188;
                  local_148._type = local_158;
                  pcVar4 = local_138;
                  iVar2 = mpt_number_tostring(&local_148,(mpt_value_format)0x0,pcVar4,0x100);
                  if (-1 < iVar2) goto LAB_0011226e;
                  bVar1 = false;
                }
                if (!bVar1) break;
                uVar8 = uVar8 + 1;
                bVar12 = uVar8 < local_160;
                iVar10 = iVar2;
              } while (bVar12);
            }
            if (bVar12) {
              return iVar2;
            }
          }
          sVar5 = (*save)(dest,"]",1);
          if ((int)sVar5 < 0) {
            return -0x11;
          }
          return iVar11 + (int)sVar5;
        }
        uVar9 = mpt_number_tostring(val,(mpt_value_format)0x0,local_138,0x100);
        local_150 = (size_t)uVar9;
        if ((int)uVar9 < 0) {
          return uVar9;
        }
        pcVar4 = local_138;
      }
      sVar5 = (*save)(dest,pcVar4,local_150);
      return (int)sVar5;
    }
    if ((mpt_object *)*local_170 != (mpt_object *)0x0) {
      iVar2 = mpt_print_object((mpt_object *)*local_170,save,dest);
      return iVar2;
    }
  }
  return 0;
}

Assistant:

extern int mpt_print_value(const MPT_STRUCT(value) *val, ssize_t (*save)(void *, const char *, size_t), void *dest)
{
	static const MPT_STRUCT(value_format) vfmt = MPT_VALFMT_INIT;
	const void *ptr;
	const char *str;
	size_t len;
	int type, curr, adv;
	char buf[256];
	
	/* missing content */
	if (!(ptr = val->_addr)) {
		return MPT_ERROR(BadValue);
	}
	/* object type */
	type = val->_type;
	if (type == MPT_ENUM(TypeObjectPtr)) {
		const MPT_INTERFACE(object) *obj = *(const void **) ptr;
		return obj ? mpt_print_object(obj, save, dest) : 0;
	}
	/* convertable type */
	if (type == MPT_ENUM(TypeConvertablePtr)) {
		MPT_INTERFACE(convertable) *conv = *(void **) ptr;
		return conv ? mpt_print_convertable(conv, save, dest) : 0;
	}
	if ((str = mpt_data_tostring(&ptr, type, &len))) {
		return save(dest, str, len);
	}
	/* vector representation in value */
	if ((curr = MPT_type_toScalar(type)) > 0) {
		const MPT_STRUCT(type_traits) *traits = mpt_type_traits(curr);
		const struct iovec *vec = ptr;
		int total;
		if (!traits || !traits->size) {
			return MPT_ERROR(BadType);
		}
		if ((total = save(dest, "[ ", 2)) < 2) {
			return MPT_ERROR(MissingBuffer);
		}
		if (vec) {
			const uint8_t *data = vec->iov_base;
			size_t i, size = traits->size, max = vec->iov_len / size;
			
			for (i = 0; i < max; i++) {
				const char *str;
				int step;
				if (curr == 's') {
					if ((str = *((const char **) data))) {
						adv = strlen(str);
					}
					else {
						adv = 0;
						str = "";
					}
				}
				else {
					MPT_STRUCT(value) pos = MPT_VALUE_INIT(curr, data);
					adv = mpt_number_tostring(&pos, vfmt, buf, sizeof(buf));
					if (adv < 0) {
						return adv;
					}
					str = buf;
				}
				if ((step = save(dest, str, adv)) < adv) {
					return MPT_ERROR(MissingBuffer);
				}
				total += step;
				if ((step = save(dest, " ", 1)) < 1) {
					return MPT_ERROR(MissingBuffer);
				}
				total += step;
				data  += size;
			}
		}
		if ((adv = save(dest, "]", 1)) < 0) {
			return MPT_ERROR(MissingBuffer);
		}
		return total + adv;
	}
	/* represent numeric value */
	if ((adv = mpt_number_tostring(val, vfmt, buf, sizeof(buf))) >= 0) {
		return save(dest, buf, adv);
	}
	return adv;
}